

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O0

void duckdb_je_buf_writer_terminate(tsdn_t *tsdn,buf_writer_t *buf_writer)

{
  buf_writer_t *in_RSI;
  
  buf_writer_assert(in_RSI);
  duckdb_je_buf_writer_flush((buf_writer_t *)0x24cddc2);
  if ((in_RSI->internal_buf & 1U) != 0) {
    buf_writer_free_internal_buf(tsdn,buf_writer);
  }
  return;
}

Assistant:

void
buf_writer_terminate(tsdn_t *tsdn, buf_writer_t *buf_writer) {
	buf_writer_assert(buf_writer);
	buf_writer_flush(buf_writer);
	if (buf_writer->internal_buf) {
		buf_writer_free_internal_buf(tsdn, buf_writer->buf);
	}
}